

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_error.c
# Opt level: O1

int qc_seterr(QcErr *err,int errcode,char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  int iVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list vl;
  char vs [255];
  undefined8 local_1f8;
  void **local_1f0;
  undefined1 *local_1e8;
  undefined1 local_1d8 [24];
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_198;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 local_138;
  char local_128 [256];
  
  if (in_AL != '\0') {
    local_1a8 = in_XMM0_Qa;
    local_198 = in_XMM1_Qa;
    local_188 = in_XMM2_Qa;
    local_178 = in_XMM3_Qa;
    local_168 = in_XMM4_Qa;
    local_158 = in_XMM5_Qa;
    local_148 = in_XMM6_Qa;
    local_138 = in_XMM7_Qa;
  }
  if (err == (QcErr *)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = 0;
    local_1c0 = in_RCX;
    local_1b8 = in_R8;
    local_1b0 = in_R9;
    memset(err,0,0x104);
    err->code = errcode;
    local_1e8 = local_1d8;
    local_1f0 = &vl[0].overflow_arg_area;
    local_1f8 = 0x3000000018;
    vsnprintf(local_128,0xff,fmt,&local_1f8);
    strncpy(err->desc,local_128,0xff);
  }
  return iVar1;
}

Assistant:

int qc_seterr(QcErr *err, int errcode, const char *fmt, ...){
    if(NULL == err)
        return -1;
    
    memset(err, 0, sizeof(QcErr));
    err->code = errcode;

    char vs[QC_MAXSIZE_ERRDESC];
    va_list vl;
    va_start(vl, fmt);
    vsnprintf(vs, sizeof(vs), fmt, vl);
    strncpy(err->desc, vs, sizeof(vs));
    va_end(vl);

    return 0;
}